

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::DecompressZip
               (uchar *dst,unsigned_long *uncompressed_size,uchar *src,unsigned_long src_size)

{
  unsigned_long uVar1;
  int iVar2;
  uchar *puVar3;
  undefined8 uVar4;
  uchar uVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (*uncompressed_size == src_size) {
    memcpy(dst,src,src_size);
    return true;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,*uncompressed_size,&local_49);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    iVar2 = mz_uncompress(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,uncompressed_size,src,src_size);
    if (iVar2 != 0) {
LAB_0022a576:
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return iVar2 == 0;
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar1 = *uncompressed_size;
      if (1 < (long)uVar1) {
        uVar5 = *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
        do {
          uVar5 = uVar5 + *puVar3 + 0x80;
          *puVar3 = uVar5;
          puVar3 = puVar3 + 1;
        } while (puVar3 < local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar1);
      }
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar1 = *uncompressed_size;
        if (0 < (long)uVar1) {
          lVar6 = 0;
          do {
            puVar3 = dst + lVar6 * 2;
            *puVar3 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar6];
            if (dst + uVar1 <= puVar3 + 1) break;
            puVar3[1] = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6 + (uVar1 + 1 >> 1)];
            lVar6 = lVar6 + 1;
          } while (puVar3 + 2 < dst + uVar1);
        }
        goto LAB_0022a576;
      }
      goto LAB_0022a63c;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0022a63c:
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

static bool DecompressZip(unsigned char *dst,
                          unsigned long *uncompressed_size /* inout */,
                          const unsigned char *src, unsigned long src_size) {
  if ((*uncompressed_size) == src_size) {
    // Data is not compressed(Issue 40).
    memcpy(dst, src, src_size);
    return true;
  }
  std::vector<unsigned char> tmpBuf(*uncompressed_size);

#if TINYEXR_USE_MINIZ
  int ret =
      mz_uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (MZ_OK != ret) {
    return false;
  }
#elif TINYEXR_USE_STB_ZLIB
  int ret = stbi_zlib_decode_buffer(reinterpret_cast<char*>(&tmpBuf.at(0)),
      *uncompressed_size, reinterpret_cast<const char*>(src), src_size);
  if (ret < 0) {
    return false;
  }
#else
  int ret = uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (Z_OK != ret) {
    return false;
  }
#endif

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + (*uncompressed_size);

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (*uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + (*uncompressed_size);

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }

  return true;
}